

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange,_unsigned_int,_unsigned_int>
* __thiscall
fmt::v10::
make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,ktx::SelectorRange,unsigned_int_const,unsigned_int_const>
          (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange,_unsigned_int,_unsigned_int>
           *__return_storage_ptr__,v10 *this,SelectorRange *args,uint *args_1,uint *args_2)

{
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  bool formattable_2;
  bool formattable_pointer_2;
  bool formattable_char_2;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_char_1;
  uint *args_local_2;
  uint *args_local_1;
  SelectorRange *args_local;
  longlong local_38;
  size_t local_30;
  
  local_38._0_4_ =
       *(undefined4 *)
        &(args->ranges).
         super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
         ._M_impl.super__Vector_impl_data._M_start;
  args_local_2._0_4_ = *args_1;
  (__return_storage_ptr__->data_).args_[0].field_0.named_args.data = (named_arg_info<char> *)this;
  (__return_storage_ptr__->data_).args_[0].field_0.custom.format =
       detail::value<fmt::v10::basic_format_context<fmt::v10::appender,char>>::
       format_custom_arg<ktx::SelectorRange,fmt::v10::formatter<ktx::SelectorRange,char,void>>;
  (__return_storage_ptr__->data_).args_[1].field_0.long_long_value = local_38;
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = local_30;
  (__return_storage_ptr__->data_).args_[2].field_0.string.data = (char *)args_local_2;
  (__return_storage_ptr__->data_).args_[2].field_0.custom.format =
       (_func_void_void_ptr_parse_context_ptr_basic_format_context<fmt::v10::appender,_char>_ptr *)
       args_local_1;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}